

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalNinjaGenerator::ConvertToIncludeReference
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,string *path,
          OutputFormat format,bool forceFullPaths)

{
  cmOutputConverter *this_00;
  char *pcVar1;
  undefined3 in_register_00000081;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (CONCAT31(in_register_00000081,forceFullPaths) == 0) {
    pcVar1 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_69);
    cmOutputConverter::ConvertToRelativePath(&local_68,this_00,&local_48,path);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_68,format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    cmsys::SystemTools::CollapseFullPath(&local_68,path);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_68,format);
    local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::ConvertToIncludeReference(
  std::string const& path, cmOutputConverter::OutputFormat format,
  bool forceFullPaths)
{
  if (forceFullPaths) {
    return this->ConvertToOutputFormat(cmSystemTools::CollapseFullPath(path),
                                       format);
  }
  return this->ConvertToOutputFormat(
    this->ConvertToRelativePath(this->GetBinaryDirectory(), path), format);
}